

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::RandomUniformCase::test
          (RandomUniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  TestLog *log;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ScopedLogSection section;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniformsiv;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniform;
  allocator<char> local_dd;
  byte local_dc;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  ScopedLogSection local_d8;
  deUint32 local_cc;
  string local_c8;
  string local_a8;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  local_78;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *local_60;
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  local_58;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
  *local_38;
  
  local_60 = basicUniforms;
  local_38 = basicUniformReportsRef;
  if (((this->super_UniformCase).super_CallLogWrapper.field_0x15 & 1) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
                      ((this->super_UniformCase).m_uniformCollection.m_ptr);
  }
  bVar1 = de::Random::getBool(rnd);
  local_da = de::Random::getBool(rnd);
  if (bVar1 && (bool)local_da) {
    bVar2 = de::Random::getBool(rnd);
    local_7c = (undefined4)CONCAT71(extraout_var,bVar2);
  }
  else {
    local_7c = 0;
  }
  local_dc = de::Random::getBool(rnd);
  if ((bool)local_dc) {
    bVar2 = de::Random::getBool(rnd);
    local_80 = (undefined4)CONCAT71(extraout_var_00,bVar2);
  }
  else {
    local_80 = 0;
  }
  bVar2 = de::Random::getBool(rnd);
  local_db = bVar2;
  if ((local_dc & bVar2) == 1) {
    bVar3 = de::Random::getBool(rnd);
    local_84 = (undefined4)CONCAT71(extraout_var_01,bVar3);
  }
  else {
    local_84 = 0;
  }
  if (bVar4 == false && bVar2) {
    bVar4 = de::Random::getBool(rnd);
  }
  else {
    bVar4 = false;
  }
  local_cc = (program->m_program).m_program;
  log = ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((~((byte)local_80 | local_db | (byte)local_84 | (byte)local_7c | local_dc | bVar1 | local_da |
        bVar4) & 1) != 0 || bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"InfoGetActiveUniform",&local_dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Uniform information queries with glGetActiveUniform()",&local_d9
              );
    tcu::ScopedLogSection::ScopedLogSection(&local_d8,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::getActiveUniforms
                      (&this->super_UniformCase,
                       (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                        *)&local_58,local_38,local_cc);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
    if (!bVar1) goto LAB_010b3baf;
  }
  if (local_da != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"InfoGetActiveUniformsiv",&local_dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()",
               &local_d9);
    tcu::ScopedLogSection::ScopedLogSection(&local_d8,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::getActiveUniformsiv(&this->super_UniformCase,&local_78,local_38,local_cc);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
    if (!bVar1) goto LAB_010b3baf;
  }
  if ((char)local_7c != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CompareUniformVsUniformsiv",&local_dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()",
               &local_d9);
    tcu::ScopedLogSection::ScopedLogSection(&local_d8,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::uniformVsUniformsivComparison
                      (&this->super_UniformCase,
                       (vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                        *)&local_58,&local_78);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
    if (!bVar1) {
LAB_010b3baf:
      std::
      vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
      ::~vector(&local_78);
      std::
      vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
      ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                 *)&local_58);
      return false;
    }
  }
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector(&local_78);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)&local_58);
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_dc != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"GetUniformDefaults",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Uniform default value query",&local_dd);
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::getUniforms(&this->super_UniformCase,&local_58,local_60,local_cc);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
    if (!bVar1) goto LAB_010b3bc8;
  }
  if ((char)local_80 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"DefaultValueCheck",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Verify that the uniforms have correct initial values (zeros)",
               &local_dd);
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::checkUniformDefaultValues(&this->super_UniformCase,&local_58,local_60);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
    if (!bVar1) goto LAB_010b3bc8;
  }
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector(&local_58);
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_db != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"UniformAssign",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Uniform value assignments",&local_dd);
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    UniformCase::assignUniforms(&this->super_UniformCase,local_60,local_cc,rnd);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
  }
  if ((byte)local_84 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"GetUniforms",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Uniform value query",&local_dd);
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = UniformCase::getUniforms(&this->super_UniformCase,&local_58,local_60,local_cc);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"ValueCheck",(allocator<char> *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Verify that the reported values match the assigned values",
                 &local_dd);
      tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_a8,&local_c8)
      ;
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      bVar1 = UniformCase::compareUniformValues(&this->super_UniformCase,&local_58,local_60);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_78);
      if (bVar1) goto LAB_010b3b13;
    }
LAB_010b3bc8:
    std::
    vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
    ::~vector(&local_58);
    return false;
  }
LAB_010b3b13:
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ::~vector(&local_58);
  if (bVar4 == false) {
    return true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"RenderTest",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Render test",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_58,log,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar4 = UniformCase::renderTest(&this->super_UniformCase,local_60,program,rnd);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_58);
  if (!bVar4) {
    return false;
  }
  return true;
}

Assistant:

bool RandomUniformCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	// \note Different sampler types may not be bound to same unit when rendering.
	const bool		renderingPossible						= (m_features & FEATURE_UNIFORMVALUE_ZERO) == 0 || !m_uniformCollection->containsSeveralSamplerTypes();

	bool			performGetActiveUniforms				= rnd.getBool();
	const bool		performGetActiveUniformsiv				= rnd.getBool();
	const bool		performUniformVsUniformsivComparison	= performGetActiveUniforms && performGetActiveUniformsiv && rnd.getBool();
	const bool		performGetUniforms						= rnd.getBool();
	const bool		performCheckUniformDefaultValues		= performGetUniforms && rnd.getBool();
	const bool		performAssignUniforms					= rnd.getBool();
	const bool		performCompareUniformValues				= performGetUniforms && performAssignUniforms && rnd.getBool();
	const bool		performRenderTest						= renderingPossible && performAssignUniforms && rnd.getBool();
	const deUint32	programGL								= program.getProgram();
	TestLog&		log										= m_testCtx.getLog();

	if (!(performGetActiveUniforms || performGetActiveUniformsiv || performUniformVsUniformsivComparison || performGetUniforms || performCheckUniformDefaultValues || performAssignUniforms || performCompareUniformValues || performRenderTest))
		performGetActiveUniforms = true; // Do something at least.

#define PERFORM_AND_CHECK(CALL, SECTION_NAME, SECTION_DESCRIPTION)						\
	do																					\
	{																					\
		const ScopedLogSection section(log, (SECTION_NAME), (SECTION_DESCRIPTION));		\
		const bool success = (CALL);													\
		if (!success)																	\
			return false;																\
	} while (false)

	{
		vector<BasicUniformReportGL> reportsUniform;
		vector<BasicUniformReportGL> reportsUniformsiv;

		if (performGetActiveUniforms)
			PERFORM_AND_CHECK(getActiveUniforms(reportsUniform, basicUniformReportsRef, programGL), "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
		if (performGetActiveUniformsiv)
			PERFORM_AND_CHECK(getActiveUniformsiv(reportsUniformsiv, basicUniformReportsRef, programGL), "InfoGetActiveUniformsiv", "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()");
		if (performUniformVsUniformsivComparison)
			PERFORM_AND_CHECK(uniformVsUniformsivComparison(reportsUniform, reportsUniformsiv), "CompareUniformVsUniformsiv", "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()");
	}

	{
		vector<VarValue> uniformDefaultValues;

		if (performGetUniforms)
			PERFORM_AND_CHECK(getUniforms(uniformDefaultValues, basicUniforms, programGL), "GetUniformDefaults", "Uniform default value query");
		if (performCheckUniformDefaultValues)
			PERFORM_AND_CHECK(checkUniformDefaultValues(uniformDefaultValues, basicUniforms), "DefaultValueCheck", "Verify that the uniforms have correct initial values (zeros)");
	}

	{
		vector<VarValue> uniformValues;

		if (performAssignUniforms)
		{
			const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
			assignUniforms(basicUniforms, programGL, rnd);
		}
		if (performCompareUniformValues)
		{
			PERFORM_AND_CHECK(getUniforms(uniformValues, basicUniforms, programGL), "GetUniforms", "Uniform value query");
			PERFORM_AND_CHECK(compareUniformValues(uniformValues, basicUniforms), "ValueCheck", "Verify that the reported values match the assigned values");
		}
	}

	if (performRenderTest)
		PERFORM_AND_CHECK(renderTest(basicUniforms, program, rnd), "RenderTest", "Render test");

#undef PERFORM_AND_CHECK

	return true;
}